

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkMiter(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fComb,int nPartSize,int fImplic,int fMulti)

{
  size_t __size;
  int iVar1;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  Abc_Ntk_t *pNtkMiter;
  char *pcVar8;
  Vec_Ptr_t *vPairs;
  void **ppvVar9;
  Abc_Obj_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  Abc_Obj_t *pObj;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  ulong local_858;
  char local_818 [1024];
  char local_418 [1000];
  
  uVar20 = (ulong)(uint)nPartSize;
  if (pNtk1->nObjCounts[8] != pNtk1->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x3f,"Abc_Ntk_t *Abc_NtkMiter(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk2->nObjCounts[8] != pNtk2->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x40,"Abc_Ntk_t *Abc_NtkMiter(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
  }
  iVar6 = Abc_NtkCompareSignals(pNtk1,pNtk2,fImplic,fComb);
  if (iVar6 == 0) {
    pNtkMiter = (Abc_Ntk_t *)0x0;
  }
  else {
    if ((pNtk1->ntkType == ABC_NTK_STRASH) && (iVar6 = Abc_NtkGetChoiceNum(pNtk1), iVar6 == 0)) {
      bVar22 = false;
    }
    else {
      pNtk1 = Abc_NtkStrash(pNtk1,0,0,0);
      bVar22 = pNtk1 != (Abc_Ntk_t *)0x0;
    }
    if ((pNtk2->ntkType == ABC_NTK_STRASH) && (iVar6 = Abc_NtkGetChoiceNum(pNtk2), iVar6 == 0)) {
      bVar23 = false;
    }
    else {
      pNtk2 = Abc_NtkStrash(pNtk2,0,0,0);
      bVar23 = pNtk2 != (Abc_Ntk_t *)0x0;
    }
    if (pNtk2 == (Abc_Ntk_t *)0x0 || pNtk1 == (Abc_Ntk_t *)0x0) {
      pNtkMiter = (Abc_Ntk_t *)0x0;
    }
    else {
      if (pNtk1->ntkType != ABC_NTK_STRASH) {
        __assert_fail("Abc_NtkIsStrash(pNtk1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                      ,0x5e,
                      "Abc_Ntk_t *Abc_NtkMiterInt(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
      }
      if (pNtk2->ntkType != ABC_NTK_STRASH) {
        __assert_fail("Abc_NtkIsStrash(pNtk2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                      ,0x5f,
                      "Abc_Ntk_t *Abc_NtkMiterInt(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
      }
      pNtkMiter = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
      sprintf(local_418,"%s_%s_miter",pNtk1->pName,pNtk2->pName);
      pcVar8 = Extra_UtilStrsav(local_418);
      pNtkMiter->pName = pcVar8;
      Abc_NtkMiterPrepare(pNtk1,pNtk2,pNtkMiter,fComb,nPartSize,fMulti);
      Abc_NtkMiterAddOne(pNtk1,pNtkMiter);
      Abc_NtkMiterAddOne(pNtk2,pNtkMiter);
      if (fMulti != 0 && nPartSize != 0) {
        __assert_fail("nPartSize == 0 || fMulti == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                      ,0x11e,
                      "void Abc_NtkMiterFinalize(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)"
                     );
      }
      vPairs = (Vec_Ptr_t *)malloc(0x10);
      vPairs->nCap = 100;
      vPairs->nSize = 0;
      ppvVar9 = (void **)malloc(800);
      vPairs->pArray = ppvVar9;
      if (fComb == 0) {
        pVVar11 = pNtk1->vPos;
        if (pVVar11->nSize < 1) {
          iVar6 = 0;
        }
        else {
          iVar6 = 0;
          uVar21 = 100;
          lVar12 = 0;
          do {
            plVar2 = (long *)pVVar11->pArray[lVar12];
            if (fMulti == 0) {
              uVar15 = *(uint *)((long)plVar2 + 0x14);
              uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                          (long)*(int *)plVar2[4] * 8) + 0x40);
              iVar7 = (int)uVar21;
              if (iVar6 == iVar7) {
                if (iVar7 < 0x10) {
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(vPairs->pArray,0x80);
                  }
                  vPairs->pArray = ppvVar9;
                  vPairs->nCap = 0x10;
                  uVar21 = 0x10;
                }
                else {
                  uVar21 = (ulong)(uint)(iVar7 * 2);
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(uVar21 * 8);
                  }
                  else {
                    ppvVar9 = (void **)realloc(vPairs->pArray,uVar21 * 8);
                  }
                  vPairs->pArray = ppvVar9;
                  vPairs->nCap = iVar7 * 2;
                }
              }
              else {
                ppvVar9 = vPairs->pArray;
              }
              iVar7 = iVar6 + 1;
              vPairs->nSize = iVar7;
              ppvVar9[iVar6] = (void *)(uVar15 >> 10 & 1 ^ uVar4);
              if (pNtk2->vPos->nSize <= lVar12) goto LAB_002e1852;
              plVar2 = (long *)pNtk2->vPos->pArray[lVar12];
              uVar15 = *(uint *)((long)plVar2 + 0x14);
              uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                          (long)*(int *)plVar2[4] * 8) + 0x40);
              if (iVar7 == (int)uVar21) {
                if (iVar6 < 0xf) {
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(vPairs->pArray,0x80);
                  }
                  vPairs->pArray = ppvVar9;
                  vPairs->nCap = 0x10;
                  uVar21 = 0x10;
                }
                else {
                  uVar17 = (int)uVar21 * 2;
                  uVar21 = (ulong)uVar17;
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(uVar21 * 8);
                  }
                  else {
                    ppvVar9 = (void **)realloc(vPairs->pArray,uVar21 * 8);
                  }
                  vPairs->pArray = ppvVar9;
                  vPairs->nCap = uVar17;
                }
              }
              else {
                ppvVar9 = vPairs->pArray;
              }
              iVar6 = iVar6 + 2;
              vPairs->nSize = iVar6;
              ppvVar9[iVar7] = (void *)(uVar15 >> 10 & 1 ^ uVar4);
            }
            else {
              if (pNtk2->vCos->nSize <= lVar12) goto LAB_002e1852;
              plVar3 = (long *)pNtk2->vCos->pArray[lVar12];
              pAVar10 = Abc_AigXor((Abc_Aig_t *)pNtkMiter->pManFunc,
                                   (Abc_Obj_t *)
                                   ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                                   *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                       (long)*(int *)plVar2[4] * 8) + 0x40)),
                                   (Abc_Obj_t *)
                                   ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                                   *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                       (long)*(int *)plVar3[4] * 8) + 0x40)));
              if (pNtkMiter->vPos->nSize <= lVar12) goto LAB_002e1852;
              Abc_ObjAddFanin((Abc_Obj_t *)pNtkMiter->vPos->pArray[lVar12],pAVar10);
            }
            lVar12 = lVar12 + 1;
            pVVar11 = pNtk1->vPos;
          } while (lVar12 < pVVar11->nSize);
        }
        pVVar11 = pNtk1->vBoxes;
        if (0 < pVVar11->nSize) {
          lVar12 = 0;
          do {
            plVar2 = (long *)pVVar11->pArray[lVar12];
            if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
              plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                 (long)*(int *)plVar2[4] * 8);
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                  (long)*(int *)plVar2[4] * 8) + 0x40)));
              pVVar11 = pNtk1->vBoxes;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar11->nSize);
        }
        pVVar11 = pNtk2->vBoxes;
        if (0 < pVVar11->nSize) {
          lVar12 = 0;
          do {
            plVar2 = (long *)pVVar11->pArray[lVar12];
            if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
              plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                 (long)*(int *)plVar2[4] * 8);
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                  (long)*(int *)plVar2[4] * 8) + 0x40)));
              pVVar11 = pNtk2->vBoxes;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar11->nSize);
        }
      }
      else {
        pVVar11 = pNtk1->vCos;
        if (pVVar11->nSize < 1) {
          iVar6 = 0;
        }
        else {
          iVar6 = 0;
          uVar21 = 100;
          lVar12 = 0;
          do {
            plVar2 = (long *)pVVar11->pArray[lVar12];
            if (fMulti == 0) {
              uVar15 = *(uint *)((long)plVar2 + 0x14);
              uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                          (long)*(int *)plVar2[4] * 8) + 0x40);
              iVar7 = (int)uVar21;
              if (iVar6 == iVar7) {
                if (iVar7 < 0x10) {
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(vPairs->pArray,0x80);
                  }
                  vPairs->pArray = ppvVar9;
                  vPairs->nCap = 0x10;
                  uVar21 = 0x10;
                }
                else {
                  uVar21 = (ulong)(uint)(iVar7 * 2);
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(uVar21 * 8);
                  }
                  else {
                    ppvVar9 = (void **)realloc(vPairs->pArray,uVar21 * 8);
                  }
                  vPairs->pArray = ppvVar9;
                  vPairs->nCap = iVar7 * 2;
                }
              }
              else {
                ppvVar9 = vPairs->pArray;
              }
              iVar7 = iVar6 + 1;
              vPairs->nSize = iVar7;
              ppvVar9[iVar6] = (void *)(uVar15 >> 10 & 1 ^ uVar4);
              if (pNtk2->vCos->nSize <= lVar12) goto LAB_002e1852;
              plVar2 = (long *)pNtk2->vCos->pArray[lVar12];
              uVar15 = *(uint *)((long)plVar2 + 0x14);
              uVar4 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                          (long)*(int *)plVar2[4] * 8) + 0x40);
              if (iVar7 == (int)uVar21) {
                if (iVar6 < 0xf) {
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(vPairs->pArray,0x80);
                  }
                  vPairs->pArray = ppvVar9;
                  vPairs->nCap = 0x10;
                  uVar21 = 0x10;
                }
                else {
                  uVar17 = (int)uVar21 * 2;
                  uVar21 = (ulong)uVar17;
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(uVar21 * 8);
                  }
                  else {
                    ppvVar9 = (void **)realloc(vPairs->pArray,uVar21 * 8);
                  }
                  vPairs->pArray = ppvVar9;
                  vPairs->nCap = uVar17;
                }
              }
              else {
                ppvVar9 = vPairs->pArray;
              }
              iVar6 = iVar6 + 2;
              vPairs->nSize = iVar6;
              ppvVar9[iVar7] = (void *)(uVar15 >> 10 & 1 ^ uVar4);
            }
            else {
              if (pNtk2->vCos->nSize <= lVar12) goto LAB_002e1852;
              plVar3 = (long *)pNtk2->vCos->pArray[lVar12];
              pAVar10 = Abc_AigXor((Abc_Aig_t *)pNtkMiter->pManFunc,
                                   (Abc_Obj_t *)
                                   ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                                   *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                       (long)*(int *)plVar2[4] * 8) + 0x40)),
                                   (Abc_Obj_t *)
                                   ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                                   *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                       (long)*(int *)plVar3[4] * 8) + 0x40)));
              if (pNtkMiter->vPos->nSize <= lVar12) goto LAB_002e1852;
              Abc_ObjAddFanin((Abc_Obj_t *)pNtkMiter->vPos->pArray[lVar12],pAVar10);
            }
            lVar12 = lVar12 + 1;
            pVVar11 = pNtk1->vCos;
          } while (lVar12 < pVVar11->nSize);
        }
      }
      if (nPartSize < 1) {
        if (fMulti == 0) {
          pAVar10 = Abc_AigMiter((Abc_Aig_t *)pNtkMiter->pManFunc,vPairs,fImplic);
          if (pNtkMiter->vPos->nSize < 1) {
LAB_002e1852:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Abc_ObjAddFanin((Abc_Obj_t *)*pNtkMiter->vPos->pArray,pAVar10);
        }
      }
      else {
        iVar7 = pNtk1->vCos->nSize;
        if (iVar6 != iVar7 * 2) {
          __assert_fail("Vec_PtrSize(vPairs) == 2 * Abc_NtkCoNum(pNtk1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                        ,0x158,
                        "void Abc_NtkMiterFinalize(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)"
                       );
        }
        pVVar11 = (Vec_Ptr_t *)malloc(0x10);
        uVar21 = 8;
        if (8 < (uint)nPartSize) {
          uVar21 = uVar20;
        }
        pVVar11->nSize = 0;
        pVVar11->nCap = (int)uVar21;
        ppvVar9 = (void **)malloc(uVar21 << 3);
        pVVar11->pArray = ppvVar9;
        uVar17 = (uint)(0 < iVar7 % nPartSize);
        uVar15 = uVar17 + iVar7 / nPartSize;
        if (uVar15 != 0 && SCARRY4(uVar17,iVar7 / nPartSize) == (int)uVar15 < 0) {
          iVar7 = 1;
          iVar19 = 0;
          lVar12 = 0;
          local_858 = 0;
          do {
            pVVar11->nSize = 0;
            uVar17 = 0;
            lVar13 = lVar12;
            uVar21 = uVar20;
            iVar18 = iVar19;
            iVar14 = iVar7;
            do {
              if (pNtk1->vCos->nSize <= iVar18) break;
              if (iVar6 <= iVar14 + -1) goto LAB_002e1852;
              pvVar5 = *(void **)((long)vPairs->pArray + lVar13);
              uVar16 = pVVar11->nCap;
              if (uVar17 == uVar16) {
                if ((int)uVar17 < 0x10) {
                  if (pVVar11->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar11->pArray,0x80);
                  }
                  pVVar11->pArray = ppvVar9;
                  pVVar11->nCap = 0x10;
                  uVar16 = 0x10;
                }
                else {
                  uVar16 = uVar17 * 2;
                  if (pVVar11->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc((ulong)uVar16 * 8);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar11->pArray,(ulong)uVar16 * 8);
                  }
                  pVVar11->pArray = ppvVar9;
                  pVVar11->nCap = uVar16;
                }
              }
              else {
                ppvVar9 = pVVar11->pArray;
              }
              iVar1 = pVVar11->nSize;
              pVVar11->nSize = iVar1 + 1U;
              ppvVar9[iVar1] = pvVar5;
              if (iVar6 <= iVar14) goto LAB_002e1852;
              pvVar5 = *(void **)((long)vPairs->pArray + lVar13 + 8);
              if (iVar1 + 1U == uVar16) {
                if (iVar1 < 0xf) {
                  if (pVVar11->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar11->pArray,0x80);
                  }
                  pVVar11->pArray = ppvVar9;
                  pVVar11->nCap = 0x10;
                }
                else {
                  __size = (ulong)(uVar16 * 2) * 8;
                  if (pVVar11->pArray == (void **)0x0) {
                    ppvVar9 = (void **)malloc(__size);
                  }
                  else {
                    ppvVar9 = (void **)realloc(pVVar11->pArray,__size);
                  }
                  pVVar11->pArray = ppvVar9;
                  pVVar11->nCap = uVar16 * 2;
                }
              }
              else {
                ppvVar9 = pVVar11->pArray;
              }
              iVar1 = pVVar11->nSize;
              uVar17 = iVar1 + 1;
              pVVar11->nSize = uVar17;
              ppvVar9[iVar1] = pvVar5;
              lVar13 = lVar13 + 0x10;
              iVar14 = iVar14 + 2;
              iVar18 = iVar18 + 1;
              uVar21 = uVar21 - 1;
            } while (uVar21 != 0);
            pAVar10 = Abc_AigMiter((Abc_Aig_t *)pNtkMiter->pManFunc,pVVar11,fImplic);
            pObj = Abc_NtkCreateObj(pNtkMiter,ABC_OBJ_PO);
            Abc_ObjAddFanin(pObj,pAVar10);
            if (nPartSize == 1) {
              if ((long)pNtk1->vCos->nSize <= (long)local_858) goto LAB_002e1852;
              pcVar8 = Abc_ObjName((Abc_Obj_t *)pNtk1->vCos->pArray[local_858]);
              strcpy(local_818,pcVar8);
            }
            else {
              sprintf(local_818,"%d",local_858 & 0xffffffff);
            }
            Abc_ObjAssignName(pObj,"miter_",local_818);
            local_858 = local_858 + 1;
            lVar12 = lVar12 + uVar20 * 0x10;
            iVar7 = iVar7 + nPartSize * 2;
            iVar19 = iVar19 + nPartSize;
          } while (local_858 != uVar15);
          ppvVar9 = pVVar11->pArray;
        }
        if (ppvVar9 != (void **)0x0) {
          free(ppvVar9);
        }
        free(pVVar11);
      }
      if (vPairs->pArray != (void **)0x0) {
        free(vPairs->pArray);
      }
      free(vPairs);
      Abc_AigCleanup((Abc_Aig_t *)pNtkMiter->pManFunc);
      iVar6 = Abc_NtkCheck(pNtkMiter);
      if (iVar6 == 0) {
        puts("Abc_NtkMiter: The network check has failed.");
        Abc_NtkDelete(pNtkMiter);
        pNtkMiter = (Abc_Ntk_t *)0x0;
      }
    }
    if (bVar22) {
      Abc_NtkDelete(pNtk1);
    }
    if (bVar23) {
      Abc_NtkDelete(pNtk2);
    }
  }
  return pNtkMiter;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiter( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fComb, int nPartSize, int fImplic, int fMulti )
{
    Abc_Ntk_t * pTemp = NULL;
    int fRemove1, fRemove2;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk1) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk2) );
    // check that the networks have the same PIs/POs/latches
    if ( !Abc_NtkCompareSignals( pNtk1, pNtk2, fImplic, fComb ) )
        return NULL;
    // make sure the circuits are strashed 
    fRemove1 = (!Abc_NtkIsStrash(pNtk1) || Abc_NtkGetChoiceNum(pNtk1)) && (pNtk1 = Abc_NtkStrash(pNtk1, 0, 0, 0));
    fRemove2 = (!Abc_NtkIsStrash(pNtk2) || Abc_NtkGetChoiceNum(pNtk2)) && (pNtk2 = Abc_NtkStrash(pNtk2, 0, 0, 0));
    if ( pNtk1 && pNtk2 )
        pTemp = Abc_NtkMiterInt( pNtk1, pNtk2, fComb, nPartSize, fImplic, fMulti );
    if ( fRemove1 )  Abc_NtkDelete( pNtk1 );
    if ( fRemove2 )  Abc_NtkDelete( pNtk2 );
    return pTemp;
}